

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O3

void Abc_SclMinsizePerform(SC_Lib *pLib,Abc_Ntk_t *p,int fUseMax,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long *plVar5;
  int *piVar6;
  Vec_Int_t *__ptr;
  long lVar7;
  int iVar8;
  SC_Lib *pLib_00;
  
  __ptr = Abc_SclFindMinAreas(pLib,fUseMax);
  pLib_00 = pLib;
  Abc_SclMioGates2SclGates(pLib,p);
  pVVar3 = p->vObjs;
  iVar8 = pVVar3->nSize;
  if (0 < iVar8) {
    ppvVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      plVar5 = (long *)ppvVar4[lVar7];
      if ((((plVar5 != (long *)0x0) && ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7)) &&
          (*(int *)((long)plVar5 + 0x1c) != 0)) &&
         (((*(int *)((long)plVar5 + 0x1c) != 1 || (*(int *)(*plVar5 + 4) != 4)) || (plVar5[7] != 0))
         )) {
        if (p->vGates->nSize <= lVar7) {
LAB_0040008f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = p->vGates->pArray;
        iVar8 = piVar6[lVar7];
        if (((long)iVar8 < 0) || (uVar1 = (pLib->vCells).nSize, (int)uVar1 <= iVar8)) {
          __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclUtil.c"
                        ,0xd6,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
        }
        if (__ptr->nSize <= iVar8) goto LAB_0040008f;
        uVar2 = __ptr->pArray[iVar8];
        if (((int)uVar2 < 0) || (uVar1 <= uVar2)) {
          __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclUtil.c"
                        ,0xd8,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
        }
        piVar6[lVar7] = uVar2;
        iVar8 = pVVar3->nSize;
      }
      lVar7 = lVar7 + 1;
      pLib_00 = (SC_Lib *)(long)iVar8;
    } while (lVar7 < (long)pLib_00);
  }
  Abc_SclSclGates2MioGates(pLib_00,p);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_SclMinsizePerform( SC_Lib * pLib, Abc_Ntk_t * p, int fUseMax, int fVerbose )
{
    Vec_Int_t * vMinCells;
    Abc_Obj_t * pObj;
    int i, gateId;
    vMinCells = Abc_SclFindMinAreas( pLib, fUseMax );
    Abc_SclMioGates2SclGates( pLib, p );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        gateId = Vec_IntEntry( p->vGates, i );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        gateId = Vec_IntEntry( vMinCells, gateId );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        Vec_IntWriteEntry( p->vGates, i, gateId );
    }
    Abc_SclSclGates2MioGates( pLib, p );
    Vec_IntFree( vMinCells );
}